

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::inductiveLoopCheck
          (TParseContext *this,TSourceLoc *loc,TIntermNode *init,TIntermLoop *loop)

{
  int iVar1;
  TOperator TVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar3;
  size_type sVar4;
  undefined4 extraout_var_01;
  reference ppTVar5;
  undefined4 extraout_var_02;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  TIntermTyped *pTVar9;
  TIntermOperator *this_00;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long *plVar10;
  long *plVar11;
  TIntermNode *body;
  bool bVar12;
  TIntermBinary *binaryTerminal;
  TIntermUnary *unaryTerminal;
  bool badTerminal;
  TIntermBinary *binaryCond;
  bool badCond;
  long local_40;
  longlong loopIndex;
  TIntermBinary *binaryInit;
  TIntermLoop *pTStack_28;
  bool badInit;
  TIntermLoop *loop_local;
  TIntermNode *init_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  undefined4 extraout_var_03;
  
  binaryInit._7_1_ = 0;
  pTStack_28 = loop;
  loop_local = (TIntermLoop *)init;
  init_local = (TIntermNode *)loc;
  loc_local = (TSourceLoc *)this;
  if ((init == (TIntermNode *)0x0) ||
     (iVar1 = (*init->_vptr_TIntermNode[6])(), CONCAT44(extraout_var,iVar1) == 0)) {
LAB_0069c262:
    binaryInit._7_1_ = 1;
  }
  else {
    iVar1 = (*(loop_local->super_TIntermNode)._vptr_TIntermNode[6])();
    pvVar3 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 400))();
    sVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size(pvVar3);
    if (sVar4 != 1) goto LAB_0069c262;
  }
  loopIndex = 0;
  if ((binaryInit._7_1_ & 1) == 0) {
    iVar1 = (*(loop_local->super_TIntermNode)._vptr_TIntermNode[6])();
    pvVar3 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 400))();
    ppTVar5 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                        (pvVar3,0);
    iVar1 = (*(*ppTVar5)->_vptr_TIntermNode[8])();
    loopIndex = CONCAT44(extraout_var_02,iVar1);
    if (loopIndex == 0) {
      binaryInit._7_1_ = 1;
    }
  }
  if ((binaryInit._7_1_ & 1) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,init_local,
               "inductive-loop init-declaration requires the form \"type-specifier loop-index = constant-expression\""
               ,"limitations","");
    return;
  }
  plVar6 = (long *)(**(code **)(*(long *)loopIndex + 0xf0))();
  uVar7 = (**(code **)(*plVar6 + 0xc0))();
  if (((uVar7 & 1) == 0) ||
     ((iVar1 = (**(code **)(*(long *)loopIndex + 0x100))(), iVar1 != 8 &&
      (iVar1 = (**(code **)(*(long *)loopIndex + 0x100))(), iVar1 != 1)))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,init_local,"inductive loop requires a scalar \'int\' or \'float\' loop index",
               "limitations","");
    return;
  }
  TVar2 = TIntermOperator::getOp((TIntermOperator *)loopIndex);
  if (TVar2 != EOpAssign) {
LAB_0069c39d:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,init_local,
               "inductive-loop init-declaration requires the form \"type-specifier loop-index = constant-expression\""
               ,"limitations","");
    return;
  }
  plVar6 = (long *)(**(code **)(*(long *)loopIndex + 400))();
  lVar8 = (**(code **)(*plVar6 + 0x60))();
  if (lVar8 == 0) goto LAB_0069c39d;
  plVar6 = (long *)(**(code **)(*(long *)loopIndex + 0x198))();
  lVar8 = (**(code **)(*plVar6 + 0x28))();
  if (lVar8 == 0) goto LAB_0069c39d;
  plVar6 = (long *)(**(code **)(*(long *)loopIndex + 400))();
  plVar6 = (long *)(**(code **)(*plVar6 + 0x60))();
  local_40 = (**(code **)(*plVar6 + 0x180))();
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::insert
            (&this->inductiveLoopIds,&local_40);
  pTVar9 = TIntermLoop::getTest(pTStack_28);
  bVar12 = pTVar9 == (TIntermTyped *)0x0;
  if (!bVar12) {
    pTVar9 = TIntermLoop::getTest(pTStack_28);
    iVar1 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[8])();
    this_00 = (TIntermOperator *)CONCAT44(extraout_var_03,iVar1);
    bVar12 = this_00 == (TIntermOperator *)0x0;
    if (((!bVar12) && (TVar2 = TIntermOperator::getOp(this_00), 1 < TVar2 - EOpEqual)) &&
       (3 < TVar2 - EOpLessThan)) {
      bVar12 = true;
    }
    if (this_00 != (TIntermOperator *)0x0) {
      iVar1 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar1) + 0x60))();
      if (lVar8 != 0) {
        iVar1 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar1) + 0x60))();
        lVar8 = (**(code **)(*plVar6 + 0x180))();
        if (lVar8 == local_40) {
          iVar1 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])();
          lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar1) + 0x28))();
          if (lVar8 != 0) goto LAB_0069c4f4;
        }
      }
      bVar12 = true;
    }
  }
LAB_0069c4f4:
  if (bVar12) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,init_local,
               "inductive-loop condition requires the form \"loop-index <comparison-op> constant-expression\""
               ,"limitations","");
    return;
  }
  pTVar9 = TIntermLoop::getTerminal(pTStack_28);
  bVar12 = pTVar9 == (TIntermTyped *)0x0;
  if (bVar12) goto LAB_0069c688;
  pTVar9 = TIntermLoop::getTerminal(pTStack_28);
  iVar1 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[7])();
  plVar6 = (long *)CONCAT44(extraout_var_07,iVar1);
  pTVar9 = TIntermLoop::getTerminal(pTStack_28);
  iVar1 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[8])();
  plVar11 = (long *)CONCAT44(extraout_var_08,iVar1);
  if ((plVar6 == (long *)0x0) && (plVar11 == (long *)0x0)) {
    bVar12 = true;
  }
  else {
    pTVar9 = TIntermLoop::getTerminal(pTStack_28);
    iVar1 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[4])();
    TVar2 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_09,iVar1));
    if ((1 < TVar2 - EOpPostIncrement) && (TVar2 != EOpAddAssign && TVar2 != EOpSubAssign)) {
      bVar12 = true;
    }
  }
  if (plVar11 != (long *)0x0) {
    plVar10 = (long *)(**(code **)(*plVar11 + 400))();
    lVar8 = (**(code **)(*plVar10 + 0x60))();
    if (lVar8 != 0) {
      plVar10 = (long *)(**(code **)(*plVar11 + 400))();
      plVar10 = (long *)(**(code **)(*plVar10 + 0x60))();
      lVar8 = (**(code **)(*plVar10 + 0x180))();
      if (lVar8 == local_40) {
        plVar11 = (long *)(**(code **)(*plVar11 + 0x198))();
        lVar8 = (**(code **)(*plVar11 + 0x28))();
        if (lVar8 != 0) goto LAB_0069c637;
      }
    }
    bVar12 = true;
  }
LAB_0069c637:
  if (plVar6 != (long *)0x0) {
    plVar11 = (long *)(**(code **)(*plVar6 + 0x188))();
    lVar8 = (**(code **)(*plVar11 + 0x60))();
    if (lVar8 != 0) {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x188))();
      plVar6 = (long *)(**(code **)(*plVar6 + 0x60))();
      lVar8 = (**(code **)(*plVar6 + 0x180))();
      if (lVar8 == local_40) goto LAB_0069c688;
    }
    bVar12 = true;
  }
LAB_0069c688:
  if (bVar12) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,init_local,
               "inductive-loop termination requires the form \"loop-index++, loop-index--, loop-index += constant-expression, or loop-index -= constant-expression\""
               ,"limitations","");
    return;
  }
  body = TIntermLoop::getBody(pTStack_28);
  inductiveLoopBodyCheck(this,body,local_40,(this->super_TParseContextBase).symbolTable);
  return;
}

Assistant:

void TParseContext::inductiveLoopCheck(const TSourceLoc& loc, TIntermNode* init, TIntermLoop* loop)
{
    // loop index init must exist and be a declaration, which shows up in the AST as an aggregate of size 1 of the declaration
    bool badInit = false;
    if (! init || ! init->getAsAggregate() || init->getAsAggregate()->getSequence().size() != 1)
        badInit = true;
    TIntermBinary* binaryInit = nullptr;
    if (! badInit) {
        // get the declaration assignment
        binaryInit = init->getAsAggregate()->getSequence()[0]->getAsBinaryNode();
        if (! binaryInit)
            badInit = true;
    }
    if (badInit) {
        error(loc, "inductive-loop init-declaration requires the form \"type-specifier loop-index = constant-expression\"", "limitations", "");
        return;
    }

    // loop index must be type int or float
    if (! binaryInit->getType().isScalar() || (binaryInit->getBasicType() != EbtInt && binaryInit->getBasicType() != EbtFloat)) {
        error(loc, "inductive loop requires a scalar 'int' or 'float' loop index", "limitations", "");
        return;
    }

    // init is the form "loop-index = constant"
    if (binaryInit->getOp() != EOpAssign || ! binaryInit->getLeft()->getAsSymbolNode() || ! binaryInit->getRight()->getAsConstantUnion()) {
        error(loc, "inductive-loop init-declaration requires the form \"type-specifier loop-index = constant-expression\"", "limitations", "");
        return;
    }

    // get the unique id of the loop index
    long long loopIndex = binaryInit->getLeft()->getAsSymbolNode()->getId();
    inductiveLoopIds.insert(loopIndex);

    // condition's form must be "loop-index relational-operator constant-expression"
    bool badCond = ! loop->getTest();
    if (! badCond) {
        TIntermBinary* binaryCond = loop->getTest()->getAsBinaryNode();
        badCond = ! binaryCond;
        if (! badCond) {
            switch (binaryCond->getOp()) {
            case EOpGreaterThan:
            case EOpGreaterThanEqual:
            case EOpLessThan:
            case EOpLessThanEqual:
            case EOpEqual:
            case EOpNotEqual:
                break;
            default:
                badCond = true;
            }
        }
        if (binaryCond && (! binaryCond->getLeft()->getAsSymbolNode() ||
                           binaryCond->getLeft()->getAsSymbolNode()->getId() != loopIndex ||
                           ! binaryCond->getRight()->getAsConstantUnion()))
            badCond = true;
    }
    if (badCond) {
        error(loc, "inductive-loop condition requires the form \"loop-index <comparison-op> constant-expression\"", "limitations", "");
        return;
    }

    // loop-index++
    // loop-index--
    // loop-index += constant-expression
    // loop-index -= constant-expression
    bool badTerminal = ! loop->getTerminal();
    if (! badTerminal) {
        TIntermUnary* unaryTerminal = loop->getTerminal()->getAsUnaryNode();
        TIntermBinary* binaryTerminal = loop->getTerminal()->getAsBinaryNode();
        if (unaryTerminal || binaryTerminal) {
            switch(loop->getTerminal()->getAsOperator()->getOp()) {
            case EOpPostDecrement:
            case EOpPostIncrement:
            case EOpAddAssign:
            case EOpSubAssign:
                break;
            default:
                badTerminal = true;
            }
        } else
            badTerminal = true;
        if (binaryTerminal && (! binaryTerminal->getLeft()->getAsSymbolNode() ||
                               binaryTerminal->getLeft()->getAsSymbolNode()->getId() != loopIndex ||
                               ! binaryTerminal->getRight()->getAsConstantUnion()))
            badTerminal = true;
        if (unaryTerminal && (! unaryTerminal->getOperand()->getAsSymbolNode() ||
                              unaryTerminal->getOperand()->getAsSymbolNode()->getId() != loopIndex))
            badTerminal = true;
    }
    if (badTerminal) {
        error(loc, "inductive-loop termination requires the form \"loop-index++, loop-index--, loop-index += constant-expression, or loop-index -= constant-expression\"", "limitations", "");
        return;
    }

    // the body
    inductiveLoopBodyCheck(loop->getBody(), loopIndex, symbolTable);
}